

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O1

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::clear(hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
        *this)

{
  _Hashtable_node<int> *p_Var1;
  _Hashtable_node<int> *p_Var2;
  pointer pp_Var3;
  ulong uVar4;
  
  pp_Var3 = (this->_M_buckets).
            super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_M_buckets).
      super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != pp_Var3) {
    uVar4 = 0;
    do {
      p_Var2 = pp_Var3[uVar4];
      while (p_Var2 != (_Hashtable_node<int> *)0x0) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2,0x10);
        p_Var2 = p_Var1;
      }
      (this->_M_buckets).
      super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar4] = (_Hashtable_node<int> *)0x0;
      uVar4 = uVar4 + 1;
      pp_Var3 = (this->_M_buckets).
                super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_M_buckets).
                                   super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var3 >> 3))
    ;
  }
  this->_M_num_elements = 0;
  return;
}

Assistant:

void hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::clear()
{
  for (size_type __i = 0; __i < _M_buckets.size(); ++__i) {
    _Node* __cur = _M_buckets[__i];
    while (__cur != 0) {
      _Node* __next = __cur->_M_next;
      _M_delete_node(__cur);
      __cur = __next;
    }
    _M_buckets[__i] = 0;
  }
  _M_num_elements = 0;
}